

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  uint64_t *puVar1;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  pointer ppeVar5;
  int *piVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  v_array<char> vVar8;
  bool bVar9;
  char cVar10;
  polyprediction *ppVar11;
  ostream *poVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  uint32_t *puVar16;
  float *pfVar17;
  ulong uVar18;
  int *piVar19;
  long lVar20;
  float fVar21;
  double dVar22;
  string outputString;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffdc8 [15];
  char in_stack_fffffffffffffdd7;
  undefined4 in_stack_fffffffffffffde0;
  uint32_t prediction;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  if ((((ec->tag)._end != (ec->tag)._begin) ||
      ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) &&
     (bVar9 = ec_is_label_definition(ec), !bVar9)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + ec->num_features;
    if (data->is_probabilities == true) {
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = 0;
      lVar15 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppeVar5;
      if (lVar15 != 0) {
        lVar15 = lVar15 >> 3;
        fVar21 = 3.4028235e+38;
        uVar18 = 0;
        do {
          if (ppeVar5[uVar18]->partial_prediction < fVar21) {
            uVar14 = uVar18 & 0xffffffff;
            fVar21 = ppeVar5[uVar18]->partial_prediction;
          }
          uVar18 = uVar18 + 1;
        } while (lVar15 + (ulong)(lVar15 == 0) != uVar18);
      }
      ppVar11 = (polyprediction *)&((ppeVar5[uVar14]->l).cs.costs._begin)->class_index;
    }
    else {
      ppVar11 = &ec->pred;
    }
    prediction = ppVar11->multiclass;
    cVar10 = (*(code *)PTR_test_label_002e1b20)(&ec->l);
    if (cVar10 == '\0') {
      lVar15 = (long)pwVar4 - (long)pwVar3;
      if (lVar15 == 0) {
        dVar22 = 0.0;
      }
      else {
        bVar13 = *hit_loss;
        lVar15 = lVar15 >> 4;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        puVar16 = &pwVar3->class_index;
        fVar21 = 0.0;
        do {
          if ((bVar13 & 1) != 0) break;
          if (prediction == *puVar16) {
            fVar21 = ((wclass *)(puVar16 + -1))->x;
            *hit_loss = true;
            bVar13 = 1;
          }
          puVar16 = puVar16 + 4;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        dVar22 = (double)fVar21;
      }
      all->sd->sum_loss = all->sd->sum_loss + dVar22;
      all->sd->sum_loss_since_last_dump = dVar22 + all->sd->sum_loss_since_last_dump;
    }
    piVar6 = (all->final_prediction_sink)._end;
    for (piVar19 = (all->final_prediction_sink)._begin; piVar19 != piVar6; piVar19 = piVar19 + 1) {
      fVar21 = (ec->pred).scalar;
      if (data->is_probabilities == false) {
        fVar21 = (float)(uint)fVar21;
      }
      (*all->print)(*piVar19,fVar21,0.0,ec->tag);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar15 = (long)pwVar4 - (long)pwVar3;
      if (lVar15 != 0) {
        lVar15 = lVar15 >> 4;
        pfVar17 = &pwVar3->partial_prediction;
        lVar20 = 0;
        do {
          if (lVar20 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdd7,1);
          }
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdd7 = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,&stack0xfffffffffffffdd7,1);
          std::ostream::_M_insert<double>((double)*pfVar17);
          lVar20 = lVar20 + 1;
          pfVar17 = pfVar17 + 4;
        } while (lVar15 + (ulong)(lVar15 == 0) != lVar20);
      }
      p_Var7 = all->print_text;
      iVar2 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar8._end._7_1_ = in_stack_fffffffffffffdd7;
      vVar8._0_15_ = in_stack_fffffffffffffdc8;
      vVar8.end_array = (char *)all;
      vVar8.erase_count._0_4_ = in_stack_fffffffffffffde0;
      vVar8.erase_count._4_4_ = prediction;
      (*p_Var7)(iVar2,(string)ec->tag,vVar8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar9 = (bool)(*(code *)PTR_test_label_002e1b20)(&ec->l);
    COST_SENSITIVE::print_update(all,bVar9,ec,ec_seq,false,prediction);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    uint32_t predicted_K = 0;
    float min_score = FLT_MAX;
    for (size_t k = 0; k < ec_seq->size(); k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}